

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiViewportP * ImGui::FindHoveredViewportFromPlatformWindowStack(ImVec2 *mouse_platform_pos)

{
  ImGuiViewportP **ppIVar1;
  bool local_41;
  ImRect local_40;
  ImGuiViewportP *local_30;
  ImGuiViewportP *viewport;
  ImGuiViewportP *pIStack_20;
  int n;
  ImGuiViewportP *best_candidate;
  ImGuiContext *g;
  ImVec2 *mouse_platform_pos_local;
  
  best_candidate = (ImGuiViewportP *)GImGui;
  pIStack_20 = (ImGuiViewportP *)0x0;
  g = (ImGuiContext *)mouse_platform_pos;
  for (viewport._4_4_ = 0; viewport._4_4_ < (int)best_candidate[0x37].DrawDataP.DisplayPos.x;
      viewport._4_4_ = viewport._4_4_ + 1) {
    ppIVar1 = ImVector<ImGuiViewportP_*>::operator[]
                        ((ImVector<ImGuiViewportP_*> *)&best_candidate[0x37].DrawDataP.DisplayPos,
                         viewport._4_4_);
    local_30 = *ppIVar1;
    local_41 = false;
    if (((local_30->super_ImGuiViewport).Flags & 0x480U) == 0) {
      local_40 = ImGuiViewportP::GetMainRect(local_30);
      local_41 = ImRect::Contains(&local_40,(ImVec2 *)g);
    }
    if ((local_41 != false) &&
       ((pIStack_20 == (ImGuiViewportP *)0x0 ||
        (pIStack_20->LastFrontMostStampCount < local_30->LastFrontMostStampCount)))) {
      pIStack_20 = local_30;
    }
  }
  return pIStack_20;
}

Assistant:

ImGuiViewportP* ImGui::FindHoveredViewportFromPlatformWindowStack(const ImVec2& mouse_platform_pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiViewportP* best_candidate = NULL;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        if (!(viewport->Flags & (ImGuiViewportFlags_NoInputs | ImGuiViewportFlags_Minimized)) && viewport->GetMainRect().Contains(mouse_platform_pos))
            if (best_candidate == NULL || best_candidate->LastFrontMostStampCount < viewport->LastFrontMostStampCount)
                best_candidate = viewport;
    }
    return best_candidate;
}